

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stats.h
# Opt level: O3

bool TestHighbitsCollisions<Blob<256>>(vector<Blob<256>,_std::allocator<Blob<256>_>_> *hashes)

{
  uint nbHBits;
  uint uVar1;
  uint uVar2;
  undefined8 in_RCX;
  uint uVar3;
  int in_ESI;
  int nbHashes;
  uint uVar4;
  double in_XMM0_Qa;
  double dVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  double local_50;
  double local_48;
  
  nbHashes = (int)((ulong)((long)(hashes->super__Vector_base<Blob<256>,_std::allocator<Blob<256>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(hashes->super__Vector_base<Blob<256>,_std::allocator<Blob<256>_>_>)
                                ._M_impl.super__Vector_impl_data._M_start) >> 5);
  nbHBits = FindMinBits_TargetCollisionShare(nbHashes,in_XMM0_Qa);
  uVar1 = FindMaxBits_TargetCollisionNb(nbHashes,in_ESI);
  if ((int)uVar1 < 0x100) {
    uVar3 = 0;
    printf("Testing collisions (high %2i-%2i bits) - ",(ulong)nbHBits,(ulong)uVar1);
    if ((int)uVar1 < (int)nbHBits) {
      printf("Worst is %2i bits: %2i/%2i (%.2fx)",0,0,0,1);
    }
    else {
      auVar7._0_8_ = (double)nbHashes;
      uVar4 = 0;
      local_48 = 1.0;
      local_50 = 0.0;
      do {
        uVar2 = CountNbCollisions<Blob<256>>(hashes,nbHBits);
        dVar5 = ldexp(1.0,nbHBits);
        auVar6._0_8_ = (auVar7._0_8_ * (double)(nbHashes + -1)) / dVar5;
        auVar6._8_8_ = 0;
        auVar7._8_8_ = 0;
        auVar6 = vminsd_avx(auVar7,auVar6);
        dVar5 = (double)(int)uVar2 / auVar6._0_8_;
        if (local_50 < dVar5) {
          uVar4 = nbHBits;
          uVar3 = uVar2;
          local_50 = dVar5;
          local_48 = auVar6._0_8_;
        }
        nbHBits = nbHBits + 1;
      } while (uVar1 + 1 != nbHBits);
      printf("Worst is %2i bits: %2i/%2i (%.2fx)",local_50,(ulong)uVar4,(ulong)uVar3,
             CONCAT44((int)((ulong)in_RCX >> 0x20),(int)local_48));
      if (2.0 < local_50) {
        puts(" !!!!!");
        return false;
      }
    }
    putchar(10);
  }
  return true;
}

Assistant:

bool TestHighbitsCollisions ( std::vector<hashtype> & hashes)
{
  int origBits = sizeof(hashtype) * 8;

  size_t const nbH = hashes.size();
  int const minBits = FindMinBits_TargetCollisionShare(nbH, 0.01);
  int const maxBits = FindMaxBits_TargetCollisionNb(nbH, 20);
  if (maxBits >= origBits) return true;

  printf("Testing collisions (high %2i-%2i bits) - ", minBits, maxBits);
  double maxCollDev = 0.0;
  int maxCollDevBits = 0;
  int maxCollDevNb = 0;
  double maxCollDevExp = 1.0;

  for (int b = minBits; b <= maxBits; b++) {
      int    const nbColls = CountNbCollisions(hashes, b);
      double const expected = EstimateNbCollisions(nbH, b);
      assert(expected > 0.0);
      double const dev = (double)nbColls / expected;
      if (dev > maxCollDev) {
          maxCollDev = dev;
          maxCollDevBits = b;
          maxCollDevNb = nbColls;
          maxCollDevExp = expected;
      }
  }

  printf("Worst is %2i bits: %2i/%2i (%.2fx)",
        maxCollDevBits, maxCollDevNb, (int)maxCollDevExp, maxCollDev);

  if (maxCollDev > 2.0) {
    printf(" !!!!!\n");
    return false;
  }

  printf("\n");
  return true;
}